

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O3

double __thiscall
amrex::BaseFab<double>::sum<(amrex::RunOn)1>
          (BaseFab<double> *this,Box *bx,DestComp dcomp,NumComps ncomp)

{
  Box *pBVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double r;
  double local_88;
  anon_class_80_3_e8713ce0 local_80;
  
  local_80.r = &local_88;
  local_88 = 0.0;
  local_80.a.p = this->dptr;
  local_80.a.ncomp = this->nvar;
  pBVar1 = &this->domain;
  local_80.a.begin.z = (this->domain).smallend.vect[2];
  local_80.a.begin.x = (pBVar1->smallend).vect[0];
  local_80.a.begin.y = (pBVar1->smallend).vect[1];
  lVar4 = (long)(this->domain).bigend.vect[1] + 1;
  iVar2 = (this->domain).bigend.vect[0];
  lVar3 = (long)(this->domain).bigend.vect[2] + 1;
  local_80.a.jstride = ((long)iVar2 - (long)(pBVar1->smallend).vect[0]) + 1;
  local_80.a.kstride = (lVar4 - (this->domain).smallend.vect[1]) * local_80.a.jstride;
  local_80.a.nstride = (lVar3 - local_80.a.begin.z) * local_80.a.kstride;
  local_80.a.end._0_8_ = (ulong)(iVar2 + 1) | lVar4 << 0x20;
  local_80.a.end.z = (int)lVar3;
  local_80.dcomp.i = dcomp.i;
  LoopOnCpu<amrex::BaseFab<double>::sum<(amrex::RunOn)1>(amrex::Box_const&,amrex::DestComp,amrex::NumComps)const::_lambda(int,int,int,int)_1_>
            (bx,ncomp.n,&local_80);
  return local_88;
}

Assistant:

T
BaseFab<T>::sum (const Box& bx, DestComp dcomp, NumComps ncomp) const noexcept
{
    AMREX_ASSERT(dcomp.i >= 0 && dcomp.i+ncomp.n <= this->nvar);

    T r = 0;
    Array4<T const> const& a = this->const_array();
#ifdef AMREX_USE_GPU
    if (run_on == RunOn::Device && Gpu::inLaunchRegion()) {
        ReduceOps<ReduceOpSum> reduce_op;
        ReduceData<T> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;
        reduce_op.eval(bx, reduce_data,
        [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            T t = 0;
            for (int n = 0; n < ncomp.n; ++n) {
                t += a(i,j,k,n+dcomp.i);
            }
            return { t };
        });
        ReduceTuple hv = reduce_data.value(reduce_op);
        r = amrex::get<0>(hv);
    } else
#endif
    {
        amrex::LoopOnCpu(bx, ncomp.n, [=,&r] (int i, int j, int k, int n) noexcept
        {
            r += a(i,j,k,n+dcomp.i);
        });
    }

    return r;
}